

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O3

QLibraryScanResult scanSections(QByteArrayView data,ErrorMaker *error)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  storage_type *__s;
  storage_type *psVar10;
  ulong uVar11;
  size_t __n;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  ulong *puVar15;
  long in_FS_OFFSET;
  QLibraryScanResult QVar16;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  QString local_50;
  long local_38;
  
  psVar10 = data.m_data;
  uVar11 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)(psVar10 + 0x3c);
  uVar2 = *(ulong *)(psVar10 + 0x28);
  if ((CARRY8((ulong)uVar1 * 0x40,uVar2)) || (uVar11 < (ulong)uVar1 * 0x40 + uVar2)) {
    QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                    "section table extends past the end of the file",(char *)0x0,-1);
    anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
    scanSections();
  }
  else {
    uVar3 = *(ulong *)(psVar10 + (ulong)*(ushort *)(psVar10 + 0x3e) * 0x40 + 0x18 + uVar2);
    uVar4 = *(ulong *)(psVar10 + (ulong)*(ushort *)(psVar10 + 0x3e) * 0x40 + 0x20 + uVar2);
    if ((CARRY8(uVar3,uVar4)) || (uVar11 < uVar3 + uVar4)) {
      QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                      "section header string table extends past the end of the file",(char *)0x0,-1)
      ;
      anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
      scanSections();
    }
    else {
      if (uVar1 != 0) {
        puVar14 = (ulong *)(psVar10 + uVar2 + 0x20);
        do {
          uVar9 = (ulong)(uint)puVar14[-4];
          __n = uVar4 - uVar9;
          if (uVar4 < uVar9 || __n == 0) {
            QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                            "a section name extends past the end of the file",(char *)0x0,-1);
            anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
            scanSections();
            goto LAB_004969f1;
          }
          __s = psVar10 + uVar9 + uVar3;
          pvVar7 = memchr(__s,0,__n);
          sVar8 = (long)pvVar7 - (long)__s;
          if (pvVar7 == (void *)0x0) {
            sVar8 = __n;
          }
          if (*(int *)((long)puVar14 + -0x1c) != 8) {
            uVar9 = puVar14[-1];
            uVar5 = *puVar14;
            if ((CARRY8(uVar9,uVar5)) || (uVar11 < uVar9 + uVar5)) {
              QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                              "section contents extend past the end of the file",(char *)0x0,-1);
              anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
              scanSections();
              goto LAB_004969f1;
            }
            if (sVar8 == 0xb) {
              rhs.m_data = ".qtmetadata";
              rhs.m_size = 0xb;
              lhs.m_data = __s;
              lhs.m_size = 0xb;
              bVar6 = QtPrivate::equalStrings(lhs,rhs);
              if (bVar6) {
                if (uVar5 < 0x10) {
                  QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                                  ".qtmetadata section is too small",(char *)0x0,-1);
                  anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
                  scanSections();
                  goto LAB_004969f1;
                }
                if (*(int *)(psVar10 + uVar9 + 8) != 0x21204154 ||
                    *(long *)(psVar10 + uVar9) != 0x41444154454d5451) {
                  QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                                  ".qtmetadata section has incorrect magic",(char *)0x0,-1);
                  anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
                  scanSections();
                  goto LAB_004969f1;
                }
                if ((puVar14[-3] & 1) != 0) {
                  QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                                  ".qtmetadata section is writable",(char *)0x0,-1);
                  anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
                  scanSections();
                  goto LAB_004969f1;
                }
                if ((puVar14[-3] & 4) == 0) {
                  lVar12 = uVar9 + 0xc;
                  lVar13 = uVar5 - 0xc;
                  goto LAB_004969f7;
                }
                QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                                ".qtmetadata section is executable",(char *)0x0,-1);
                anon_unknown.dwarf_187bda4::ErrorMaker::operator()(error,&local_50);
                scanSections();
                goto LAB_004969f1;
              }
            }
          }
          puVar15 = puVar14 + 4;
          puVar14 = puVar14 + 8;
        } while (puVar15 != (ulong *)(psVar10 + (ulong)uVar1 * 0x40 + uVar2));
      }
      anon_unknown.dwarf_187bda4::ErrorMaker::notfound(error);
    }
  }
LAB_004969f1:
  lVar12 = 0;
  lVar13 = 0;
LAB_004969f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar16.length = lVar13;
    QVar16.pos = lVar12;
    return QVar16;
  }
  __stack_chk_fail();
}

Assistant:

static QLibraryScanResult scanSections(QByteArrayView data, const ErrorMaker &error)
{
    auto header = reinterpret_cast<const T::Ehdr *>(data.data());

    // in order to find the .qtmetadata section, we need to:
    // a) find the section table
    //    it's located at offset header->e_shoff
    // validate it
    T::Word e_shnum = header->e_shnum;
    T::Off offset = e_shnum * sizeof(T::Shdr);          // can't overflow due to size of T::Half
    if (qAddOverflow(offset, header->e_shoff, &offset) || offset > size_t(data.size()))
        return error(QLibrary::tr("section table extends past the end of the file"));

    // b) find the section entry for the section header string table (shstrab)
    //    it's a section whose entry is pointed by e_shstrndx
    auto sections = reinterpret_cast<const T::Shdr *>(data.data() + header->e_shoff);
    auto sections_end = sections + e_shnum;
    auto shdr = sections + header->e_shstrndx;

    // validate the shstrtab
    offset = shdr->sh_offset;
    T::Off shstrtab_size = shdr->sh_size;
    qEDebug << "shstrtab section is located at offset" << offset << "size" << shstrtab_size;
    if (T::Off end; qAddOverflow<T::Off>(offset, shstrtab_size, &end)
            || end > size_t(data.size()))
        return error(QLibrary::tr("section header string table extends past the end of the file"));

    // c) iterate over the sections to find .qtmetadata
    const char *shstrtab_start = data.data() + offset;
    shdr = sections;
    for (int section = 0; shdr != sections_end; ++section, ++shdr) {
        QLatin1StringView name;
        if (shdr->sh_name < shstrtab_size) {
            const char *namestart = shstrtab_start + shdr->sh_name;
            size_t len = qstrnlen(namestart, shstrtab_size - shdr->sh_name);
            name = QLatin1StringView(namestart, len);
        }
        qEDebug << "section" << section << "name" << name << ElfSectionDebug{shdr};

        // sanity check the section
        if (name.isNull())
            return error(QLibrary::tr("a section name extends past the end of the file"));

        // sections aren't allowed to extend past the end of the file, unless
        // they are NOBITS sections
        if (shdr->sh_type == SHT_NOBITS)
            continue;
        if (T::Off end; qAddOverflow(shdr->sh_offset, shdr->sh_size, &end)
                || end > size_t(data.size())) {
            return error(QLibrary::tr("section contents extend past the end of the file"));
        }

        if (name != ".qtmetadata"_L1)
            continue;
        qEDebug << "found .qtmetadata section";
        if (shdr->sh_size < sizeof(QPluginMetaData::MagicHeader))
            return error(QLibrary::tr(".qtmetadata section is too small"));

        if (IncludeValidityChecks) {
            QByteArrayView expectedMagic = QByteArrayView::fromArray(QPluginMetaData::MagicString);
            QByteArrayView actualMagic = data.sliced(shdr->sh_offset, expectedMagic.size());
            if (expectedMagic != actualMagic)
                return error(QLibrary::tr(".qtmetadata section has incorrect magic"));

            if (shdr->sh_flags & SHF_WRITE)
                return error(QLibrary::tr(".qtmetadata section is writable"));
            if (shdr->sh_flags & SHF_EXECINSTR)
                return error(QLibrary::tr(".qtmetadata section is executable"));
        }

        return { qsizetype(shdr->sh_offset + sizeof(QPluginMetaData::MagicString)),
                 qsizetype(shdr->sh_size - sizeof(QPluginMetaData::MagicString)) };
    }

    // section .qtmetadata not found
    return error.notfound();
}